

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,bool hmm)

{
  undefined1 local_40 [8];
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> tmp;
  bool hmm_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words_local;
  string *sentence_local;
  MixSegment *this_local;
  
  tmp.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = hmm;
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_40);
  Cut(this,sentence,(vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_40,
      (bool)(tmp.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  GetStringsFromWords((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_40,words);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)local_40);
  return;
}

Assistant:

void Cut(const string& sentence, vector<string>& words, bool hmm) const {
    vector<Word> tmp;
    Cut(sentence, tmp, hmm);
    GetStringsFromWords(tmp, words);
  }